

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

uint64_t __thiscall
fmp4_stream::ingest_stream::get_media_segment_data
          (ingest_stream *this,size_t index,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *media_seg_dat)

{
  uint64_t uVar1;
  int iVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  reference pvVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  undefined4 extraout_var;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a8;
  uchar *local_a0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_98;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  uchar *local_88;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  uchar *local_78;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68;
  uchar *local_60;
  uchar *local_58;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  int local_3c;
  long lStack_38;
  int k;
  size_t ptr_of;
  uint64_t ssize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *media_seg_dat_local;
  size_t index_local;
  ingest_stream *this_local;
  
  ssize = (uint64_t)media_seg_dat;
  media_seg_dat_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)index;
  index_local = (size_t)this;
  pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::
           size(&this->media_fragment_);
  if (media_seg_dat_local < pvVar3) {
    pvVar4 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ::operator[](&this->media_fragment_,(size_type)media_seg_dat_local);
    uVar1 = (pvVar4->moof_box_).large_size_;
    pvVar4 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ::operator[](&this->media_fragment_,(size_type)media_seg_dat_local);
    ptr_of = uVar1 + (pvVar4->mdat_box_).large_size_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ssize,ptr_of);
    lStack_38 = 0;
    local_3c = 0;
    while( true ) {
      uVar5 = (ulong)local_3c;
      pvVar4 = std::
               vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::
               operator[](&this->media_fragment_,(size_type)media_seg_dat_local);
      sVar6 = std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::size
                        (&pvVar4->emsg_);
      if (sVar6 <= uVar5) break;
      pvVar4 = std::
               vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::
               operator[](&this->media_fragment_,(size_type)media_seg_dat_local);
      pvVar7 = std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::operator[]
                         (&pvVar4->emsg_,(long)local_3c);
      local_48._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              (&(pvVar7->super_full_box).super_box.box_data_);
      pvVar4 = std::
               vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::
               operator[](&this->media_fragment_,(size_type)media_seg_dat_local);
      pvVar7 = std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::operator[]
                         (&pvVar4->emsg_,(long)local_3c);
      local_50._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              (&(pvVar7->super_full_box).super_box.box_data_);
      local_58 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ssize)
      ;
      local_60 = (uchar *)std::
                          copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                    (local_48,local_50,
                                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      )local_58);
      pvVar4 = std::
               vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::
               operator[](&this->media_fragment_,(size_type)media_seg_dat_local);
      pvVar7 = std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::operator[]
                         (&pvVar4->emsg_,(long)local_3c);
      iVar2 = (**(pvVar7->super_full_box).super_box._vptr_box)();
      lStack_38 = CONCAT44(extraout_var,iVar2) + lStack_38;
      local_3c = local_3c + 1;
    }
    pvVar4 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ::operator[](&this->media_fragment_,(size_type)media_seg_dat_local);
    local_68._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            (&(pvVar4->moof_box_).box_data_);
    pvVar4 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ::operator[](&this->media_fragment_,(size_type)media_seg_dat_local);
    local_70._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            (&(pvVar4->moof_box_).box_data_);
    local_80._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ssize);
    local_78 = (uchar *)__gnu_cxx::
                        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+(&local_80,lStack_38);
    local_88 = (uchar *)std::
                        copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                  (local_68,local_70,
                                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    )local_78);
    pvVar4 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ::operator[](&this->media_fragment_,(size_type)media_seg_dat_local);
    local_90._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            (&(pvVar4->mdat_box_).box_data_);
    pvVar4 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ::operator[](&this->media_fragment_,(size_type)media_seg_dat_local);
    local_98._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            (&(pvVar4->mdat_box_).box_data_);
    local_b0._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ssize);
    pvVar4 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ::operator[](&this->media_fragment_,(size_type)media_seg_dat_local);
    local_a8 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_b0,(pvVar4->moof_box_).large_size_);
    local_a0 = (uchar *)__gnu_cxx::
                        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+(&local_a8,lStack_38);
    std::
    copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (local_90,local_98,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_a0);
    this_local = (ingest_stream *)ptr_of;
  }
  else {
    this_local = (ingest_stream *)0x0;
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t ingest_stream::get_media_segment_data(
		std::size_t index, std::vector<uint8_t> &media_seg_dat)
	{
		if (!(media_fragment_.size() > index))
			return 0;

		uint64_t ssize = media_fragment_[index].moof_box_.large_size_ + media_fragment_[index].mdat_box_.large_size_;
		media_seg_dat.resize(ssize);

		// copy emsgs
		size_t ptr_of = 0;
		for (int k = 0; k < media_fragment_[index].emsg_.size(); k++)
		{
			std::copy(media_fragment_[index].emsg_[k].box_data_.begin(),
				media_fragment_[index].emsg_[k].box_data_.end(),
				media_seg_dat.begin());
			ptr_of += media_fragment_[index].emsg_[k].size();
		}

		// copy moviefragmentbox
		std::copy(media_fragment_[index].moof_box_.box_data_.begin(), 
			      media_fragment_[index].moof_box_.box_data_.end(), 
			      media_seg_dat.begin() + ptr_of
	    );
		// copy mdat
		std::copy(media_fragment_[index].mdat_box_.box_data_.begin(), 
			      media_fragment_[index].mdat_box_.box_data_.end(), 
			      media_seg_dat.begin() + media_fragment_[index].moof_box_.large_size_ + ptr_of
	    );

		return ssize;
	}